

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

Attribute * Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::makeNewAttribute(void)

{
  float (*pafVar1) [4];
  TypedAttribute<Imath_3_2::Matrix44<float>_> *this;
  
  this = (TypedAttribute<Imath_3_2::Matrix44<float>_> *)operator_new(0x48);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)0x0;
  *(float *)((long)((this->_value).x + 0) + 0) = 0.0;
  *(float *)((long)((this->_value).x + 0) + 4) = 0.0;
  *(float *)((long)((this->_value).x + 0) + 8) = 0.0;
  *(float *)((long)((this->_value).x + 0) + 0xc) = 0.0;
  *(float *)((long)((this->_value).x + 1) + 0) = 0.0;
  *(float *)((long)((this->_value).x + 1) + 4) = 0.0;
  pafVar1 = (this->_value).x;
  *(float *)((long)(pafVar1 + 1) + 8) = 0.0;
  *(float *)((long)(pafVar1 + 1) + 0xc) = 0.0;
  *(float *)((long)((this->_value).x + 2) + 0) = 0.0;
  *(float *)((long)((this->_value).x + 2) + 4) = 0.0;
  pafVar1 = (this->_value).x;
  *(float *)((long)(pafVar1 + 2) + 8) = 0.0;
  *(float *)((long)(pafVar1 + 2) + 0xc) = 0.0;
  *(float *)((long)((this->_value).x + 3) + 0) = 0.0;
  *(float *)((long)((this->_value).x + 3) + 4) = 0.0;
  pafVar1 = (this->_value).x;
  *(float *)((long)(pafVar1 + 3) + 8) = 0.0;
  *(float *)((long)(pafVar1 + 3) + 0xc) = 0.0;
  TypedAttribute(this);
  return &this->super_Attribute;
}

Assistant:

Attribute*
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T> ();
}